

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O2

void __thiscall
duckdb::PayloadScanner::PayloadScanner
          (PayloadScanner *this,SortedData *sorted_data,GlobalSortState *global_sort_state,
          bool flush_p)

{
  pointer puVar1;
  element_type *peVar2;
  int iVar3;
  idx_t iVar4;
  undefined4 extraout_var;
  pointer pRVar5;
  type args;
  type args_1;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *block;
  pointer puVar6;
  idx_t block_size;
  bool local_61;
  RowDataBlock local_60;
  
  local_60.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->heap;
  local_60.count = (idx_t)&this->scanner;
  (this->rows).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false> =
       (_Head_base<0UL,_duckdb::RowDataCollection_*,_false>)0x0;
  (this->heap).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->scanner).
  super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
       (RowDataCollectionScanner *)0x0;
  local_61 = flush_p;
  iVar4 = SortedData::Count(sorted_data);
  local_60.capacity = (idx_t)global_sort_state;
  iVar3 = (*global_sort_state->buffer_manager->_vptr_BufferManager[0xf])();
  local_60.byte_offset = CONCAT44(extraout_var,iVar3);
  local_60.entry_size._4_4_ = 1;
  make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long_const&,unsigned_int>
            ((duckdb *)&local_60,*(BufferManager **)(local_60.capacity + 0x30),&local_60.byte_offset
             ,(uint *)((long)&local_60.entry_size + 4));
  peVar2 = local_60.block.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)this,(pointer)peVar2);
  ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
               *)&local_60);
  pRVar5 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->rows);
  pRVar5->count = iVar4;
  local_60.entry_size._4_4_ = 1;
  make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long_const&,unsigned_int>
            ((duckdb *)&local_60,*(BufferManager **)(local_60.capacity + 0x30),&local_60.byte_offset
             ,(uint *)((long)&local_60.entry_size + 4));
  peVar2 = local_60.block.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)local_60.block.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
          (pointer)peVar2);
  ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
               *)&local_60);
  if ((sorted_data->layout).all_constant == false) {
    pRVar5 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                           *)local_60.block.internal.
                             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    pRVar5->count = iVar4;
  }
  if (flush_p) {
    pRVar5 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(&this->rows);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::_M_move_assign(&(pRVar5->blocks).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ,&sorted_data->data_blocks);
    if ((sorted_data->layout).all_constant == false) {
      pRVar5 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                             *)local_60.block.internal.
                               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::_M_move_assign(&(pRVar5->blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ,&sorted_data->heap_blocks);
    }
  }
  else {
    puVar1 = (sorted_data->data_blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (sorted_data->data_blocks).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      pRVar5 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
               ::operator->(&this->rows);
      unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::operator->
                (puVar6);
      RowDataBlock::Copy(&local_60);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                  *)&pRVar5->blocks,
                 (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  *)&local_60);
      ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::
      ~unique_ptr((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
                  &local_60);
    }
    if ((sorted_data->layout).all_constant == false) {
      puVar1 = (sorted_data->heap_blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = (sorted_data->heap_blocks).
                    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1
          ) {
        pRVar5 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                 ::operator->((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                               *)local_60.block.internal.
                                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
        unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
        operator->(puVar6);
        RowDataBlock::Copy(&local_60);
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                    *)&pRVar5->blocks,
                   (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    *)&local_60);
        ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::
        ~unique_ptr((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
                    &local_60);
      }
    }
  }
  args = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*(&this->rows);
  args_1 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator*((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                        *)local_60.block.internal.
                          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
  make_uniq<duckdb::RowDataCollectionScanner,duckdb::RowDataCollection&,duckdb::RowDataCollection&,duckdb::RowLayout_const&,bool&,bool&>
            ((duckdb *)&local_60,args,args_1,&sorted_data->layout,
             (bool *)(local_60.capacity + 0x290),&local_61);
  peVar2 = local_60.block.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
           *)local_60.count,(pointer)peVar2);
  ::std::
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ::~unique_ptr((unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                 *)&local_60);
  return;
}

Assistant:

PayloadScanner::PayloadScanner(SortedData &sorted_data, GlobalSortState &global_sort_state, bool flush_p) {
	auto count = sorted_data.Count();
	auto &layout = sorted_data.layout;
	const auto block_size = global_sort_state.buffer_manager.GetBlockSize();

	// Create collections to put the data into so we can use RowDataCollectionScanner
	rows = make_uniq<RowDataCollection>(global_sort_state.buffer_manager, block_size, 1U);
	rows->count = count;

	heap = make_uniq<RowDataCollection>(global_sort_state.buffer_manager, block_size, 1U);
	if (!sorted_data.layout.AllConstant()) {
		heap->count = count;
	}

	if (flush_p) {
		// If we are flushing, we can just move the data
		rows->blocks = std::move(sorted_data.data_blocks);
		if (!layout.AllConstant()) {
			heap->blocks = std::move(sorted_data.heap_blocks);
		}
	} else {
		// Not flushing, create references to the blocks
		for (auto &block : sorted_data.data_blocks) {
			rows->blocks.emplace_back(block->Copy());
		}
		if (!layout.AllConstant()) {
			for (auto &block : sorted_data.heap_blocks) {
				heap->blocks.emplace_back(block->Copy());
			}
		}
	}

	scanner = make_uniq<RowDataCollectionScanner>(*rows, *heap, layout, global_sort_state.external, flush_p);
}